

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles3::Functional::MatrixCaseUtils::writeMatrixConstructor<2,2>
               (ostream *str,Matrix<float,_2,_2> *m)

{
  int precision;
  int extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"mat",3);
  std::ostream::operator<<(str,2);
  std::__ostream_insert<char,std::char_traits<char>>(str,"(",1);
  uVar1 = extraout_RDX;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      precision = (int)uVar1;
      if (lVar2 == 1 || lVar3 == 1) {
        std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
        precision = extraout_EDX;
      }
      de::floatToString_abi_cxx11_
                (&local_50,(de *)&DAT_00000001,
                 ((Vector<tcu::Vector<float,_2>,_2> *)((Vector<float,_2> *)m)->m_data)->m_data[0].
                 m_data[lVar3],precision);
      std::__ostream_insert<char,std::char_traits<char>>
                (str,local_50._M_dataplus._M_p,local_50._M_string_length);
      uVar1 = extraout_RDX_00;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        uVar1 = extraout_RDX_01;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    m = (Matrix<float,_2,_2> *)((long)m + 8);
    bVar4 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar4);
  std::__ostream_insert<char,std::char_traits<char>>(str,")",1);
  return;
}

Assistant:

void writeMatrixConstructor (std::ostream& str, const tcu::Matrix<float, Rows, Cols>& m)
{
	if (Rows == Cols)
		str << "mat" << Cols;
	else
		str << "mat" << Cols << "x" << Rows;

	str << "(";
	for (int colNdx = 0; colNdx < Cols; colNdx++)
	{
		for (int rowNdx = 0; rowNdx < Rows; rowNdx++)
		{
			if (rowNdx > 0 || colNdx > 0)
				str << ", ";
			str << de::floatToString(m(rowNdx, colNdx), 1);
		}
	}
	str << ")";
}